

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  uchar uVar1;
  ushort uVar2;
  stbi__uint32 sVar3;
  bool bVar4;
  bool bVar5;
  undefined8 uVar6;
  char cVar7;
  stbi__uint16 sVar8;
  int iVar9;
  uint uVar10;
  stbi__uint32 sVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  char *pcVar19;
  stbi_uc *psVar20;
  void *pvVar21;
  stbi__context *data;
  uchar *data_00;
  float *data_01;
  stbi_uc *psVar22;
  stbi__uint16 *data_02;
  byte *pbVar23;
  uchar *puVar24;
  byte bVar25;
  uint uVar26;
  stbi_uc *psVar27;
  byte *pbVar28;
  stbi_uc sVar29;
  uint uVar30;
  long lVar31;
  int iVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  uint uVar36;
  int iVar37;
  stbi__uint32 sVar38;
  int iVar39;
  stbi__uint16 *psVar40;
  stbi__uint16 *psVar41;
  long in_FS_OFFSET;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar113;
  int iVar121;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar122 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  int iVar152;
  int iVar156;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  stbi_uc pal [256] [4];
  uint local_8964;
  uint local_8958;
  stbi__uint16 *local_8930;
  ulong local_8928;
  stbi__uint16 *local_8910;
  stbi__bmp_data local_88cc;
  stbi__gif local_88a8;
  
  psVar27 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  iVar9 = stbi__check_png_header(s);
  psVar22 = s->img_buffer_original;
  s->img_buffer = psVar22;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar9 != 0) {
    if ((uint)req_comp < 5) {
      local_88a8._0_8_ = s;
      iVar9 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      uVar6 = local_88a8._0_8_;
      if (iVar9 == 0) {
        data = (stbi__context *)0x0;
      }
      else {
        iVar9 = 8;
        if ((8 < local_88a8.flags) && (iVar9 = 0x10, local_88a8.flags != 0x10)) {
          pcVar19 = "bad bits_per_channel";
          goto LAB_0010ef6e;
        }
        ri->bits_per_channel = iVar9;
        data = (stbi__context *)local_88a8.history;
        if ((req_comp != 0) && (iVar9 = *(int *)(local_88a8._0_8_ + 0xc), iVar9 != req_comp)) {
          if (local_88a8.flags < 9) {
            data = (stbi__context *)
                   stbi__convert_format
                             (local_88a8.history,iVar9,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                              *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          else {
            data = (stbi__context *)
                   stbi__convert_format16
                             ((stbi__uint16 *)local_88a8.history,iVar9,req_comp,
                              *(stbi__uint32 *)local_88a8._0_8_,
                              *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          *(int *)(uVar6 + 0xc) = req_comp;
          if (data == (stbi__context *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(stbi__uint32 *)uVar6;
        *y = *(stbi__uint32 *)(uVar6 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar6 + 8);
        }
        local_88a8.history = (stbi_uc *)0x0;
      }
      free(local_88a8.history);
      free(local_88a8.background);
      goto LAB_0010f40b;
    }
    pcVar19 = "bad req_comp";
    goto LAB_0010ef6e;
  }
  if (psVar22 < s->img_buffer_original_end) {
LAB_0010efad:
    psVar20 = psVar22 + 1;
    s->img_buffer = psVar20;
    if (*psVar22 != 'B') goto LAB_0010f154;
    if (s->img_buffer_end <= psVar20) {
      if (s->read_from_callbacks == 0) goto LAB_0010f154;
      stbi__refill_buffer(s);
      psVar20 = s->img_buffer;
    }
    s->img_buffer = psVar20 + 1;
    if (*psVar20 != 'M') goto LAB_0010f154;
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    uVar10 = stbi__get16le(s);
    iVar9 = stbi__get16le(s);
    uVar10 = iVar9 << 0x10 | uVar10;
    if (((0x38 < uVar10) || ((0x100010000001000U >> ((ulong)uVar10 & 0x3f) & 1) == 0)) &&
       (uVar10 != 0x6c)) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (uVar10 == 0x7c) goto LAB_0010f078;
      goto LAB_0010f168;
    }
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_0010f078:
    local_88cc.all_a = 0xff;
    pvVar21 = stbi__bmp_parse_header(s,&local_88cc);
    if (pvVar21 == (void *)0x0) {
      return (void *)0x0;
    }
    uVar10 = s->img_y;
    uVar14 = -uVar10;
    if (0 < (int)uVar10) {
      uVar14 = uVar10;
    }
    s->img_y = uVar14;
    if ((uVar14 < 0x1000001) && (uVar30 = s->img_x, uVar30 < 0x1000001)) {
      if (local_88cc.hsz == 0xc) {
        if (0x17 < local_88cc.bpp) goto LAB_0010f631;
        uVar26 = ((local_88cc.offset - local_88cc.extra_read) + -0x18) / 3;
LAB_0010f607:
        local_8928 = (ulong)uVar26;
        if (uVar26 == 0) goto LAB_0010f631;
        bVar5 = false;
LAB_0010f6b8:
        bVar4 = local_88cc.ma == 0xff000000;
        iVar9 = 4 - (uint)(local_88cc.ma == 0);
        iVar32 = local_88cc.bpp;
      }
      else {
        if (local_88cc.bpp < 0x10) {
          uVar26 = local_88cc.offset - (local_88cc.extra_read + local_88cc.hsz) >> 2;
          goto LAB_0010f607;
        }
LAB_0010f631:
        if (s->img_buffer + ((long)s->callback_already_read - (long)s->img_buffer_original) !=
            (stbi_uc *)(long)local_88cc.offset) {
          pcVar19 = "bad offset";
          goto LAB_0010ef6e;
        }
        local_8928 = 0;
        bVar4 = true;
        bVar5 = bVar4;
        if (local_88cc.bpp != 0x18 || local_88cc.ma != 0xff000000) goto LAB_0010f6b8;
        local_8928 = 0;
        iVar9 = 3;
        iVar32 = 0x18;
        bVar5 = true;
      }
      local_8958 = local_88cc.all_a;
      s->img_n = iVar9;
      if (2 < req_comp) {
        iVar9 = req_comp;
      }
      iVar13 = stbi__mad3sizes_valid(iVar9,uVar30,uVar14,0);
      if (iVar13 == 0) goto LAB_0010fa81;
      data_00 = (uchar *)stbi__malloc_mad3(iVar9,uVar30,uVar14,0);
      if (data_00 != (uchar *)0x0) {
        if (iVar32 < 0x10) {
          iVar13 = (int)local_8928;
          if (!bVar5 && iVar13 < 0x101) {
            if (0 < iVar13) {
              psVar27 = s->img_buffer;
              uVar34 = 0;
              psVar22 = psVar27;
              do {
                psVar20 = s->img_buffer_end;
                if (psVar27 < psVar20) {
LAB_0010f8c0:
                  psVar22 = psVar27 + 1;
                  s->img_buffer = psVar22;
                  sVar29 = *psVar27;
                  psVar27 = psVar22;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar27 = s->img_buffer;
                    psVar20 = s->img_buffer_end;
                    goto LAB_0010f8c0;
                  }
                  sVar29 = '\0';
                }
                local_88a8.pal[uVar34 - 0xd][2] = sVar29;
                if (psVar27 < psVar20) {
LAB_0010f903:
                  psVar22 = psVar27 + 1;
                  s->img_buffer = psVar22;
                  sVar29 = *psVar27;
                  psVar27 = psVar22;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar27 = s->img_buffer;
                    psVar20 = s->img_buffer_end;
                    goto LAB_0010f903;
                  }
                  sVar29 = '\0';
                }
                local_88a8.pal[uVar34 - 0xd][1] = sVar29;
                if (psVar27 < psVar20) {
LAB_0010f93e:
                  psVar22 = psVar27 + 1;
                  s->img_buffer = psVar22;
                  sVar29 = *psVar27;
                  psVar27 = psVar22;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar27 = s->img_buffer;
                    goto LAB_0010f93e;
                  }
                  sVar29 = '\0';
                }
                local_88a8.pal[uVar34 - 0xd][0] = sVar29;
                if (local_88cc.hsz != 0xc) {
                  if (s->img_buffer_end <= psVar22) {
                    psVar27 = psVar22;
                    if (s->read_from_callbacks == 0) goto LAB_0010f98f;
                    stbi__refill_buffer(s);
                    psVar22 = s->img_buffer;
                  }
                  psVar27 = psVar22 + 1;
                  s->img_buffer = psVar27;
                  psVar22 = psVar27;
                }
LAB_0010f98f:
                local_88a8.pal[uVar34 - 0xd][3] = 0xff;
                uVar34 = uVar34 + 1;
              } while (local_8928 != uVar34);
            }
            stbi__skip(s,(iVar13 * (local_88cc.hsz == 0xc | 0xfffffffc) + local_88cc.offset) -
                         (local_88cc.hsz + local_88cc.extra_read));
            if (iVar32 == 1) {
              sVar11 = s->img_y;
              if (0 < (int)sVar11) {
                sVar3 = s->img_x;
                iVar13 = 0;
                iVar32 = 0;
                do {
                  pbVar23 = s->img_buffer;
                  if (pbVar23 < s->img_buffer_end) {
LAB_001100cf:
                    s->img_buffer = pbVar23 + 1;
                    uVar14 = (uint)*pbVar23;
                    pbVar23 = pbVar23 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar23 = s->img_buffer;
                      goto LAB_001100cf;
                    }
                    uVar14 = 0;
                  }
                  sVar11 = s->img_x;
                  if (0 < (int)sVar11) {
                    sVar38 = 0;
                    uVar30 = 7;
                    do {
                      uVar34 = (ulong)((uVar14 >> (uVar30 & 0x1f) & 1) != 0);
                      data_00[iVar13] = local_88a8.pal[uVar34 - 0xd][0];
                      data_00[(long)iVar13 + 1] = local_88a8.pal[uVar34 - 0xd][1];
                      data_00[(long)iVar13 + 2] = local_88a8.pal[uVar34 - 0xd][2];
                      iVar37 = iVar13 + 3;
                      if (iVar9 == 4) {
                        data_00[(long)iVar13 + 3] = 0xff;
                        iVar37 = iVar13 + 4;
                      }
                      iVar13 = iVar37;
                      sVar38 = sVar38 + 1;
                      if (sVar38 == sVar11) break;
                      if ((int)uVar30 < 1) {
                        if (s->img_buffer_end <= pbVar23) {
                          if (s->read_from_callbacks == 0) {
                            uVar14 = 0;
                            uVar30 = 7;
                            goto LAB_00110197;
                          }
                          stbi__refill_buffer(s);
                          pbVar23 = s->img_buffer;
                          sVar11 = s->img_x;
                        }
                        s->img_buffer = pbVar23 + 1;
                        uVar14 = (uint)*pbVar23;
                        uVar30 = 7;
                        pbVar23 = pbVar23 + 1;
                      }
                      else {
                        uVar30 = uVar30 - 1;
                      }
LAB_00110197:
                    } while ((int)sVar38 < (int)sVar11);
                  }
                  stbi__skip(s,-(sVar3 + 7 >> 3) & 3);
                  iVar32 = iVar32 + 1;
                  sVar11 = s->img_y;
                } while (iVar32 < (int)sVar11);
              }
            }
            else {
              if (iVar32 == 8) {
                uVar14 = s->img_x;
              }
              else {
                if (iVar32 != 4) {
                  free(data_00);
                  pcVar19 = "bad bpp";
                  goto LAB_0010ef6e;
                }
                uVar14 = s->img_x + 1 >> 1;
              }
              sVar11 = s->img_y;
              if (0 < (int)sVar11) {
                local_8910._0_4_ = -uVar14 & 3;
                uVar34 = 0;
                iVar13 = 0;
                do {
                  if (0 < (int)s->img_x) {
                    pbVar23 = s->img_buffer;
                    iVar37 = 0;
                    do {
                      if (pbVar23 < s->img_buffer_end) {
LAB_0010ff30:
                        s->img_buffer = pbVar23 + 1;
                        uVar14 = (uint)*pbVar23;
                        pbVar23 = pbVar23 + 1;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          pbVar23 = s->img_buffer;
                          goto LAB_0010ff30;
                        }
                        uVar14 = 0;
                      }
                      uVar26 = uVar14 & 0xf;
                      uVar30 = uVar14 >> 4;
                      if (iVar32 != 4) {
                        uVar30 = uVar14;
                      }
                      uVar35 = (ulong)uVar30;
                      if (iVar32 != 4) {
                        uVar26 = 0;
                      }
                      lVar31 = (long)(int)uVar34;
                      uVar33 = lVar31 + 3;
                      data_00[lVar31] = local_88a8.pal[uVar35 - 0xd][0];
                      data_00[lVar31 + 1] = local_88a8.pal[uVar35 - 0xd][1];
                      data_00[lVar31 + 2] = local_88a8.pal[uVar35 - 0xd][2];
                      if (iVar9 == 4) {
                        data_00[lVar31 + 3] = 0xff;
                        uVar33 = (ulong)((int)uVar34 + 4);
                      }
                      if (iVar37 + 1U == s->img_x) {
                        uVar34 = uVar33 & 0xffffffff;
                        break;
                      }
                      if (iVar32 == 8) {
                        if (s->img_buffer_end <= pbVar23) {
                          if (s->read_from_callbacks == 0) {
                            uVar26 = 0;
                            goto LAB_0010fff1;
                          }
                          stbi__refill_buffer(s);
                          pbVar23 = s->img_buffer;
                        }
                        s->img_buffer = pbVar23 + 1;
                        uVar26 = (uint)*pbVar23;
                        pbVar23 = pbVar23 + 1;
                      }
LAB_0010fff1:
                      lVar31 = (long)(int)uVar33;
                      uVar34 = lVar31 + 3;
                      uVar35 = (ulong)uVar26;
                      data_00[lVar31] = local_88a8.pal[uVar35 - 0xd][0];
                      data_00[lVar31 + 1] = local_88a8.pal[uVar35 - 0xd][1];
                      data_00[lVar31 + 2] = local_88a8.pal[uVar35 - 0xd][2];
                      if (iVar9 == 4) {
                        data_00[lVar31 + 3] = 0xff;
                        uVar34 = (ulong)((int)uVar33 + 4);
                      }
                      iVar37 = iVar37 + 2;
                    } while (iVar37 < (int)s->img_x);
                  }
                  stbi__skip(s,(uint)local_8910);
                  iVar13 = iVar13 + 1;
                  sVar11 = s->img_y;
                } while (iVar13 < (int)sVar11);
              }
            }
            goto LAB_001101de;
          }
          free(data_00);
          pcVar19 = "invalid";
          goto LAB_0010ef6e;
        }
        stbi__skip(s,local_88cc.offset - (local_88cc.hsz + local_88cc.extra_read));
        if (iVar32 != 0x10) {
          if (iVar32 == 0x20) {
            local_8964 = 0;
            if ((bool)((local_88cc.mr == 0xff0000 &&
                       (local_88cc.mg == 0xff00 && local_88cc.mb == 0xff)) & bVar4)) {
              bVar4 = true;
              goto LAB_0010fac2;
            }
            goto LAB_0010fb13;
          }
          local_8964 = 0;
          if (iVar32 != 0x18) goto LAB_0010fb13;
          local_8964 = s->img_x & 3;
          bVar4 = false;
LAB_0010fac2:
          bVar5 = false;
          iVar152 = 0;
          iVar13 = 0;
          iVar37 = 0;
          iVar15 = 0;
          uVar14 = 0;
          uVar30 = 0;
          uVar26 = 0;
          uVar16 = 0;
LAB_0010fc13:
          sVar11 = s->img_y;
          if (0 < (int)sVar11) {
            iVar121 = 0;
            iVar156 = 0;
            do {
              if (bVar5) {
                if (0 < (int)s->img_x) {
                  iVar39 = 0;
                  do {
                    uVar17 = stbi__get16le(s);
                    if (iVar32 != 0x10) {
                      iVar18 = stbi__get16le(s);
                      uVar17 = uVar17 | iVar18 << 0x10;
                    }
                    iVar18 = stbi__shiftsigned(uVar17 & local_88cc.mr,iVar152,uVar14);
                    data_00[iVar121] = (uchar)iVar18;
                    iVar18 = stbi__shiftsigned(uVar17 & local_88cc.mg,iVar13,uVar30);
                    data_00[(long)iVar121 + 1] = (uchar)iVar18;
                    iVar18 = stbi__shiftsigned(uVar17 & local_88cc.mb,iVar37,uVar26);
                    data_00[(long)iVar121 + 2] = (uchar)iVar18;
                    if (local_88cc.ma == 0) {
                      uVar17 = 0xff;
                    }
                    else {
                      uVar17 = stbi__shiftsigned(uVar17 & local_88cc.ma,iVar15,uVar16);
                    }
                    iVar18 = iVar121 + 3;
                    if (iVar9 == 4) {
                      data_00[(long)iVar121 + 3] = (uchar)uVar17;
                      iVar18 = iVar121 + 4;
                    }
                    iVar121 = iVar18;
                    local_8958 = local_8958 | uVar17;
                    iVar39 = iVar39 + 1;
                  } while (iVar39 < (int)s->img_x);
                }
              }
              else if (0 < (int)s->img_x) {
                pbVar23 = s->img_buffer;
                iVar39 = 0;
                do {
                  pbVar28 = s->img_buffer_end;
                  if (pbVar23 < pbVar28) {
LAB_0010fd71:
                    s->img_buffer = pbVar23 + 1;
                    bVar25 = *pbVar23;
                    pbVar23 = pbVar23 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar23 = s->img_buffer;
                      pbVar28 = s->img_buffer_end;
                      goto LAB_0010fd71;
                    }
                    bVar25 = 0;
                  }
                  data_00[(long)iVar121 + 2] = bVar25;
                  if (pbVar23 < pbVar28) {
LAB_0010fdb8:
                    s->img_buffer = pbVar23 + 1;
                    bVar25 = *pbVar23;
                    pbVar23 = pbVar23 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar23 = s->img_buffer;
                      pbVar28 = s->img_buffer_end;
                      goto LAB_0010fdb8;
                    }
                    bVar25 = 0;
                  }
                  data_00[(long)iVar121 + 1] = bVar25;
                  if (pbVar23 < pbVar28) {
LAB_0010fdf4:
                    s->img_buffer = pbVar23 + 1;
                    bVar25 = *pbVar23;
                    pbVar23 = pbVar23 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar23 = s->img_buffer;
                      goto LAB_0010fdf4;
                    }
                    bVar25 = 0;
                  }
                  data_00[iVar121] = bVar25;
                  bVar25 = 0xff;
                  if (bVar4) {
                    if (s->img_buffer_end <= pbVar23) {
                      if (s->read_from_callbacks == 0) {
                        bVar25 = 0;
                        goto LAB_0010fe4b;
                      }
                      stbi__refill_buffer(s);
                      pbVar23 = s->img_buffer;
                    }
                    s->img_buffer = pbVar23 + 1;
                    bVar25 = *pbVar23;
                    pbVar23 = pbVar23 + 1;
                  }
LAB_0010fe4b:
                  iVar18 = iVar121 + 3;
                  if (iVar9 == 4) {
                    data_00[(long)iVar121 + 3] = bVar25;
                    iVar18 = iVar121 + 4;
                  }
                  iVar121 = iVar18;
                  local_8958 = local_8958 | bVar25;
                  iVar39 = iVar39 + 1;
                } while (iVar39 < (int)s->img_x);
              }
              stbi__skip(s,local_8964);
              iVar156 = iVar156 + 1;
              sVar11 = s->img_y;
            } while (iVar156 < (int)sVar11);
          }
LAB_001101de:
          auVar78 = _DAT_001242e0;
          auVar126 = _DAT_001242d0;
          auVar74 = _DAT_001242c0;
          auVar53 = _DAT_001242b0;
          auVar128 = _DAT_001242a0;
          auVar44 = _DAT_00124290;
          auVar122 = _DAT_00124280;
          if (((iVar9 == 4) && (local_8958 == 0)) &&
             (uVar14 = s->img_x * sVar11 * 4 - 1, -1 < (int)uVar14)) {
            uVar30 = uVar14 >> 2;
            auVar79._4_4_ = 0;
            auVar79._0_4_ = uVar30;
            auVar79._8_4_ = uVar30;
            auVar79._12_4_ = 0;
            puVar24 = data_00 + uVar14;
            uVar34 = 0;
            auVar51._8_4_ = 0xffffffff;
            auVar51._0_8_ = 0xffffffffffffffff;
            auVar51._12_4_ = 0xffffffff;
            do {
              auVar129._8_4_ = (int)uVar34;
              auVar129._0_8_ = uVar34;
              auVar129._12_4_ = (int)(uVar34 >> 0x20);
              auVar131 = auVar79 | auVar78;
              auVar133 = (auVar129 | auVar126) ^ auVar78;
              iVar32 = auVar131._0_4_;
              iVar152 = -(uint)(iVar32 < auVar133._0_4_);
              iVar13 = auVar131._4_4_;
              auVar135._4_4_ = -(uint)(iVar13 < auVar133._4_4_);
              iVar37 = auVar131._8_4_;
              iVar156 = -(uint)(iVar37 < auVar133._8_4_);
              iVar15 = auVar131._12_4_;
              auVar135._12_4_ = -(uint)(iVar15 < auVar133._12_4_);
              auVar145._4_4_ = iVar152;
              auVar145._0_4_ = iVar152;
              auVar145._8_4_ = iVar156;
              auVar145._12_4_ = iVar156;
              auVar131 = pshuflw(in_XMM1,auVar145,0xe8);
              auVar134._4_4_ = -(uint)(auVar133._4_4_ == iVar13);
              auVar134._12_4_ = -(uint)(auVar133._12_4_ == iVar15);
              auVar134._0_4_ = auVar134._4_4_;
              auVar134._8_4_ = auVar134._12_4_;
              auVar56 = pshuflw(in_XMM2,auVar134,0xe8);
              auVar135._0_4_ = auVar135._4_4_;
              auVar135._8_4_ = auVar135._12_4_;
              auVar133 = pshuflw(auVar131,auVar135,0xe8);
              auVar131 = (auVar133 | auVar56 & auVar131) ^ auVar51;
              auVar131 = packssdw(auVar131,auVar131);
              if ((auVar131 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *puVar24 = 0xff;
              }
              auVar135 = auVar134 & auVar145 | auVar135;
              auVar131 = packssdw(auVar135,auVar135);
              auVar131 = packssdw(auVar131 ^ auVar51,auVar131 ^ auVar51);
              auVar131 = packsswb(auVar131,auVar131);
              if ((auVar131._0_4_ >> 8 & 1) != 0) {
                puVar24[-4] = 0xff;
              }
              auVar131 = (auVar129 | auVar74) ^ auVar78;
              auVar133._0_4_ = -(uint)(iVar32 < auVar131._0_4_);
              auVar133._4_4_ = -(uint)(iVar13 < auVar131._4_4_);
              auVar133._8_4_ = -(uint)(iVar37 < auVar131._8_4_);
              auVar133._12_4_ = -(uint)(iVar15 < auVar131._12_4_);
              auVar56._4_4_ = auVar133._0_4_;
              auVar56._0_4_ = auVar133._0_4_;
              auVar56._8_4_ = auVar133._8_4_;
              auVar56._12_4_ = auVar133._8_4_;
              iVar152 = -(uint)(auVar131._4_4_ == iVar13);
              iVar156 = -(uint)(auVar131._12_4_ == iVar15);
              auVar146._4_4_ = iVar152;
              auVar146._0_4_ = iVar152;
              auVar146._8_4_ = iVar156;
              auVar146._12_4_ = iVar156;
              auVar153._4_4_ = auVar133._4_4_;
              auVar153._0_4_ = auVar133._4_4_;
              auVar153._8_4_ = auVar133._12_4_;
              auVar153._12_4_ = auVar133._12_4_;
              auVar131 = auVar146 & auVar56 | auVar153;
              auVar131 = packssdw(auVar131,auVar131);
              auVar131 = packssdw(auVar131 ^ auVar51,auVar131 ^ auVar51);
              auVar131 = packsswb(auVar131,auVar131);
              if ((auVar131._0_4_ >> 0x10 & 1) != 0) {
                puVar24[-8] = 0xff;
              }
              auVar131 = pshufhw(auVar131,auVar56,0x84);
              auVar56 = pshufhw(auVar133,auVar146,0x84);
              auVar133 = pshufhw(auVar131,auVar153,0x84);
              auVar131 = (auVar133 | auVar56 & auVar131) ^ auVar51;
              auVar131 = packssdw(auVar131,auVar131);
              auVar131 = packsswb(auVar131,auVar131);
              if ((auVar131._0_4_ >> 0x18 & 1) != 0) {
                puVar24[-0xc] = 0xff;
              }
              auVar131 = (auVar129 | auVar53) ^ auVar78;
              auVar57._0_4_ = -(uint)(iVar32 < auVar131._0_4_);
              auVar57._4_4_ = -(uint)(iVar13 < auVar131._4_4_);
              auVar57._8_4_ = -(uint)(iVar37 < auVar131._8_4_);
              auVar57._12_4_ = -(uint)(iVar15 < auVar131._12_4_);
              auVar147._4_4_ = auVar57._0_4_;
              auVar147._0_4_ = auVar57._0_4_;
              auVar147._8_4_ = auVar57._8_4_;
              auVar147._12_4_ = auVar57._8_4_;
              auVar56 = pshuflw(auVar153,auVar147,0xe8);
              auVar48._0_4_ = -(uint)(auVar131._0_4_ == iVar32);
              auVar48._4_4_ = -(uint)(auVar131._4_4_ == iVar13);
              auVar48._8_4_ = -(uint)(auVar131._8_4_ == iVar37);
              auVar48._12_4_ = -(uint)(auVar131._12_4_ == iVar15);
              auVar136._4_4_ = auVar48._4_4_;
              auVar136._0_4_ = auVar48._4_4_;
              auVar136._8_4_ = auVar48._12_4_;
              auVar136._12_4_ = auVar48._12_4_;
              auVar131 = pshuflw(auVar48,auVar136,0xe8);
              auVar137._4_4_ = auVar57._4_4_;
              auVar137._0_4_ = auVar57._4_4_;
              auVar137._8_4_ = auVar57._12_4_;
              auVar137._12_4_ = auVar57._12_4_;
              auVar133 = pshuflw(auVar57,auVar137,0xe8);
              auVar131 = packssdw(auVar131 & auVar56,(auVar133 | auVar131 & auVar56) ^ auVar51);
              auVar131 = packsswb(auVar131,auVar131);
              if ((auVar131 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar24[-0x10] = 0xff;
              }
              auVar137 = auVar136 & auVar147 | auVar137;
              auVar133 = packssdw(auVar137,auVar137);
              auVar131 = packssdw(auVar131,auVar133 ^ auVar51);
              auVar131 = packsswb(auVar131,auVar131);
              if ((auVar131._4_2_ >> 8 & 1) != 0) {
                puVar24[-0x14] = 0xff;
              }
              auVar131 = (auVar129 | auVar128) ^ auVar78;
              auVar58._0_4_ = -(uint)(iVar32 < auVar131._0_4_);
              auVar58._4_4_ = -(uint)(iVar13 < auVar131._4_4_);
              auVar58._8_4_ = -(uint)(iVar37 < auVar131._8_4_);
              auVar58._12_4_ = -(uint)(iVar15 < auVar131._12_4_);
              auVar138._4_4_ = auVar58._0_4_;
              auVar138._0_4_ = auVar58._0_4_;
              auVar138._8_4_ = auVar58._8_4_;
              auVar138._12_4_ = auVar58._8_4_;
              iVar152 = -(uint)(auVar131._4_4_ == iVar13);
              iVar156 = -(uint)(auVar131._12_4_ == iVar15);
              auVar148._4_4_ = iVar152;
              auVar148._0_4_ = iVar152;
              auVar148._8_4_ = iVar156;
              auVar148._12_4_ = iVar156;
              auVar154._4_4_ = auVar58._4_4_;
              auVar154._0_4_ = auVar58._4_4_;
              auVar154._8_4_ = auVar58._12_4_;
              auVar154._12_4_ = auVar58._12_4_;
              auVar131 = auVar148 & auVar138 | auVar154;
              auVar131 = packssdw(auVar131,auVar131);
              auVar131 = packssdw(auVar131 ^ auVar51,auVar131 ^ auVar51);
              auVar131 = packsswb(auVar131,auVar131);
              if ((auVar131 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar24[-0x18] = 0xff;
              }
              auVar131 = pshufhw(auVar131,auVar138,0x84);
              auVar56 = pshufhw(auVar58,auVar148,0x84);
              auVar133 = pshufhw(auVar131,auVar154,0x84);
              auVar131 = (auVar133 | auVar56 & auVar131) ^ auVar51;
              auVar131 = packssdw(auVar131,auVar131);
              auVar131 = packsswb(auVar131,auVar131);
              if ((auVar131._6_2_ >> 8 & 1) != 0) {
                puVar24[-0x1c] = 0xff;
              }
              auVar131 = (auVar129 | auVar44) ^ auVar78;
              auVar59._0_4_ = -(uint)(iVar32 < auVar131._0_4_);
              auVar59._4_4_ = -(uint)(iVar13 < auVar131._4_4_);
              auVar59._8_4_ = -(uint)(iVar37 < auVar131._8_4_);
              auVar59._12_4_ = -(uint)(iVar15 < auVar131._12_4_);
              auVar149._4_4_ = auVar59._0_4_;
              auVar149._0_4_ = auVar59._0_4_;
              auVar149._8_4_ = auVar59._8_4_;
              auVar149._12_4_ = auVar59._8_4_;
              auVar56 = pshuflw(auVar154,auVar149,0xe8);
              auVar49._0_4_ = -(uint)(auVar131._0_4_ == iVar32);
              auVar49._4_4_ = -(uint)(auVar131._4_4_ == iVar13);
              auVar49._8_4_ = -(uint)(auVar131._8_4_ == iVar37);
              auVar49._12_4_ = -(uint)(auVar131._12_4_ == iVar15);
              auVar139._4_4_ = auVar49._4_4_;
              auVar139._0_4_ = auVar49._4_4_;
              auVar139._8_4_ = auVar49._12_4_;
              auVar139._12_4_ = auVar49._12_4_;
              auVar131 = pshuflw(auVar49,auVar139,0xe8);
              auVar140._4_4_ = auVar59._4_4_;
              auVar140._0_4_ = auVar59._4_4_;
              auVar140._8_4_ = auVar59._12_4_;
              auVar140._12_4_ = auVar59._12_4_;
              auVar133 = pshuflw(auVar59,auVar140,0xe8);
              auVar133 = (auVar133 | auVar131 & auVar56) ^ auVar51;
              auVar133 = packssdw(auVar133,auVar133);
              auVar131 = packsswb(auVar131 & auVar56,auVar133);
              if ((auVar131 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar24[-0x20] = 0xff;
              }
              auVar140 = auVar139 & auVar149 | auVar140;
              auVar133 = packssdw(auVar140,auVar140);
              auVar133 = packssdw(auVar133 ^ auVar51,auVar133 ^ auVar51);
              auVar131 = packsswb(auVar131,auVar133);
              if ((auVar131._8_2_ >> 8 & 1) != 0) {
                puVar24[-0x24] = 0xff;
              }
              auVar131 = (auVar129 | auVar122) ^ auVar78;
              auVar60._0_4_ = -(uint)(iVar32 < auVar131._0_4_);
              auVar60._4_4_ = -(uint)(iVar13 < auVar131._4_4_);
              auVar60._8_4_ = -(uint)(iVar37 < auVar131._8_4_);
              auVar60._12_4_ = -(uint)(iVar15 < auVar131._12_4_);
              auVar141._4_4_ = auVar60._0_4_;
              auVar141._0_4_ = auVar60._0_4_;
              auVar141._8_4_ = auVar60._8_4_;
              auVar141._12_4_ = auVar60._8_4_;
              iVar152 = -(uint)(auVar131._4_4_ == iVar13);
              iVar156 = -(uint)(auVar131._12_4_ == iVar15);
              auVar150._4_4_ = iVar152;
              auVar150._0_4_ = iVar152;
              auVar150._8_4_ = iVar156;
              auVar150._12_4_ = iVar156;
              auVar155._4_4_ = auVar60._4_4_;
              auVar155._0_4_ = auVar60._4_4_;
              auVar155._8_4_ = auVar60._12_4_;
              auVar155._12_4_ = auVar60._12_4_;
              auVar131 = auVar150 & auVar141 | auVar155;
              auVar131 = packssdw(auVar131,auVar131);
              auVar131 = packssdw(auVar131 ^ auVar51,auVar131 ^ auVar51);
              auVar131 = packsswb(auVar131,auVar131);
              if ((auVar131 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar24[-0x28] = 0xff;
              }
              auVar131 = pshufhw(auVar131,auVar141,0x84);
              auVar56 = pshufhw(auVar60,auVar150,0x84);
              auVar133 = pshufhw(auVar131,auVar155,0x84);
              auVar131 = (auVar133 | auVar56 & auVar131) ^ auVar51;
              auVar131 = packssdw(auVar131,auVar131);
              auVar131 = packsswb(auVar131,auVar131);
              if ((auVar131._10_2_ >> 8 & 1) != 0) {
                puVar24[-0x2c] = 0xff;
              }
              auVar131 = (auVar129 | _DAT_00124270) ^ auVar78;
              auVar61._0_4_ = -(uint)(iVar32 < auVar131._0_4_);
              auVar61._4_4_ = -(uint)(iVar13 < auVar131._4_4_);
              auVar61._8_4_ = -(uint)(iVar37 < auVar131._8_4_);
              auVar61._12_4_ = -(uint)(iVar15 < auVar131._12_4_);
              auVar151._4_4_ = auVar61._0_4_;
              auVar151._0_4_ = auVar61._0_4_;
              auVar151._8_4_ = auVar61._8_4_;
              auVar151._12_4_ = auVar61._8_4_;
              auVar56 = pshuflw(auVar155,auVar151,0xe8);
              auVar50._0_4_ = -(uint)(auVar131._0_4_ == iVar32);
              auVar50._4_4_ = -(uint)(auVar131._4_4_ == iVar13);
              auVar50._8_4_ = -(uint)(auVar131._8_4_ == iVar37);
              auVar50._12_4_ = -(uint)(auVar131._12_4_ == iVar15);
              auVar142._4_4_ = auVar50._4_4_;
              auVar142._0_4_ = auVar50._4_4_;
              auVar142._8_4_ = auVar50._12_4_;
              auVar142._12_4_ = auVar50._12_4_;
              auVar131 = pshuflw(auVar50,auVar142,0xe8);
              auVar143._4_4_ = auVar61._4_4_;
              auVar143._0_4_ = auVar61._4_4_;
              auVar143._8_4_ = auVar61._12_4_;
              auVar143._12_4_ = auVar61._12_4_;
              auVar133 = pshuflw(auVar61,auVar143,0xe8);
              auVar131 = packssdw(auVar131 & auVar56,(auVar133 | auVar131 & auVar56) ^ auVar51);
              auVar131 = packsswb(auVar131,auVar131);
              if ((auVar131 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar24[-0x30] = 0xff;
              }
              auVar143 = auVar142 & auVar151 | auVar143;
              auVar133 = packssdw(auVar143,auVar143);
              auVar131 = packssdw(auVar131,auVar133 ^ auVar51);
              auVar131 = packsswb(auVar131,auVar131);
              if ((auVar131._12_2_ >> 8 & 1) != 0) {
                puVar24[-0x34] = 0xff;
              }
              auVar133 = (auVar129 | _DAT_00124260) ^ auVar78;
              auVar131._0_4_ = -(uint)(iVar32 < auVar133._0_4_);
              auVar131._4_4_ = -(uint)(iVar13 < auVar133._4_4_);
              auVar131._8_4_ = -(uint)(iVar37 < auVar133._8_4_);
              auVar131._12_4_ = -(uint)(iVar15 < auVar133._12_4_);
              auVar144._4_4_ = auVar131._0_4_;
              auVar144._0_4_ = auVar131._0_4_;
              auVar144._8_4_ = auVar131._8_4_;
              auVar144._12_4_ = auVar131._8_4_;
              auVar130._4_4_ = -(uint)(auVar133._4_4_ == iVar13);
              auVar130._12_4_ = -(uint)(auVar133._12_4_ == iVar15);
              auVar130._0_4_ = auVar130._4_4_;
              auVar130._8_4_ = auVar130._12_4_;
              auVar132._4_4_ = auVar131._4_4_;
              auVar132._0_4_ = auVar131._4_4_;
              auVar132._8_4_ = auVar131._12_4_;
              auVar132._12_4_ = auVar131._12_4_;
              auVar133 = auVar130 & auVar144 | auVar132;
              auVar131 = packssdw(auVar131,auVar133);
              auVar131 = packssdw(auVar131 ^ auVar51,auVar131 ^ auVar51);
              auVar131 = packsswb(auVar131,auVar131);
              if ((auVar131 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar24[-0x38] = 0xff;
              }
              auVar131 = pshufhw(auVar131,auVar144,0x84);
              in_XMM2 = pshufhw(auVar133,auVar130,0x84);
              in_XMM2 = in_XMM2 & auVar131;
              auVar131 = pshufhw(auVar131,auVar132,0x84);
              auVar131 = (auVar131 | in_XMM2) ^ auVar51;
              auVar131 = packssdw(auVar131,auVar131);
              in_XMM1 = packsswb(auVar131,auVar131);
              if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                puVar24[-0x3c] = 0xff;
              }
              uVar34 = uVar34 + 0x10;
              puVar24 = puVar24 + -0x40;
            } while ((uVar30 + 0x10 & 0x3ffffff0) != uVar34);
          }
          if ((int)uVar10 < 1) {
            uVar10 = s->img_x;
          }
          else {
            uVar10 = s->img_x;
            if (0 < (int)sVar11 >> 1) {
              uVar14 = uVar10 * iVar9;
              uVar30 = (sVar11 - 1) * uVar14;
              uVar34 = 0;
              uVar35 = 0;
              do {
                if (0 < (int)uVar14) {
                  uVar33 = 0;
                  do {
                    uVar1 = data_00[uVar33 + uVar34];
                    data_00[uVar33 + uVar34] = data_00[uVar33 + uVar30];
                    data_00[uVar33 + uVar30] = uVar1;
                    uVar33 = uVar33 + 1;
                  } while (uVar14 != uVar33);
                }
                uVar35 = uVar35 + 1;
                uVar30 = uVar30 - uVar14;
                uVar34 = (ulong)((int)uVar34 + uVar14);
              } while (uVar35 != (uint)((int)sVar11 >> 1));
            }
          }
          if ((req_comp != 0) && (iVar9 != req_comp)) {
            data_00 = stbi__convert_format(data_00,iVar9,req_comp,uVar10,sVar11);
            if (data_00 == (uchar *)0x0) {
              return (void *)0x0;
            }
            uVar10 = s->img_x;
          }
          *x = uVar10;
          *y = s->img_y;
          if (comp != (int *)0x0) {
            *comp = s->img_n;
            return data_00;
          }
          return data_00;
        }
        local_8964 = s->img_x * 2 & 2;
LAB_0010fb13:
        if ((local_88cc.mg != 0 && local_88cc.mr != 0) && local_88cc.mb != 0) {
          iVar152 = stbi__high_bit(local_88cc.mr);
          uVar14 = stbi__bitcount(local_88cc.mr);
          iVar13 = stbi__high_bit(local_88cc.mg);
          uVar30 = stbi__bitcount(local_88cc.mg);
          iVar37 = stbi__high_bit(local_88cc.mb);
          uVar26 = stbi__bitcount(local_88cc.mb);
          iVar15 = stbi__high_bit(local_88cc.ma);
          uVar16 = stbi__bitcount(local_88cc.ma);
          if ((uVar26 < 9 && (uVar30 < 9 && uVar14 < 9)) && uVar16 < 9) {
            iVar152 = iVar152 + -7;
            iVar13 = iVar13 + -7;
            iVar37 = iVar37 + -7;
            iVar15 = iVar15 + -7;
            bVar5 = true;
            bVar4 = false;
            goto LAB_0010fc13;
          }
        }
        free(data_00);
        pcVar19 = "bad masks";
        goto LAB_0010ef6e;
      }
LAB_00110e23:
      pcVar19 = "outofmem";
      goto LAB_0010ef6e;
    }
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar22 = s->img_buffer;
      goto LAB_0010efad;
    }
LAB_0010f154:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_0010f168:
    iVar9 = stbi__gif_test(s);
    if (iVar9 != 0) {
      memset(&local_88a8,0,0x8870);
      data = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,psVar27);
      if (data == (stbi__context *)0x0 || data == s) {
        if (local_88a8.out != (stbi_uc *)0x0) {
          free(local_88a8.out);
        }
        data = (stbi__context *)0x0;
      }
      else {
        *x = local_88a8.w;
        *y = local_88a8.h;
        if ((req_comp & 0xfffffffbU) != 0) {
          data = (stbi__context *)
                 stbi__convert_format((uchar *)data,4,req_comp,local_88a8.w,local_88a8.h);
        }
      }
      free(local_88a8.history);
      local_88a8.out = local_88a8.background;
LAB_0010f40b:
      free(local_88a8.out);
      return data;
    }
    iVar9 = stbi__get16be(s);
    uVar10 = stbi__get16be(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if ((uVar10 | iVar9 << 0x10) != 0x38425053) {
      iVar9 = stbi__pic_test(s);
      if (iVar9 != 0) {
        pvVar21 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
        return pvVar21;
      }
      iVar9 = stbi__jpeg_test(s);
      if (iVar9 != 0) {
        pvVar21 = stbi__jpeg_load(s,x,y,comp,req_comp,ri_00);
        return pvVar21;
      }
      iVar9 = stbi__pnm_test(s);
      if (iVar9 != 0) {
        pvVar21 = stbi__pnm_load(s,x,y,comp,req_comp,ri);
        return pvVar21;
      }
      iVar9 = stbi__hdr_test(s);
      if (iVar9 != 0) {
        data_01 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        psVar22 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
        return psVar22;
      }
      iVar9 = stbi__tga_test(s);
      if (iVar9 != 0) {
        pvVar21 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
        return pvVar21;
      }
      pcVar19 = "unknown image type";
      goto LAB_0010ef6e;
    }
    iVar9 = stbi__get16be(s);
    uVar10 = stbi__get16be(s);
    if ((uVar10 | iVar9 << 0x10) != 0x38425053) {
      pcVar19 = "not PSD";
      goto LAB_0010ef6e;
    }
    iVar9 = stbi__get16be(s);
    if (iVar9 != 1) {
      pcVar19 = "wrong version";
      goto LAB_0010ef6e;
    }
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
      psVar22 = s->img_buffer;
LAB_0010f4d2:
      s->img_buffer = psVar22 + 6;
    }
    else {
      psVar22 = s->img_buffer;
      iVar9 = (int)s->img_buffer_end - (int)psVar22;
      if (5 < iVar9) goto LAB_0010f4d2;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar9);
    }
    uVar10 = stbi__get16be(s);
    if (0x10 < uVar10) {
      pcVar19 = "wrong channel count";
      goto LAB_0010ef6e;
    }
    iVar9 = stbi__get16be(s);
    uVar16 = iVar9 * 0x10000;
    uVar14 = stbi__get16be(s);
    uVar26 = uVar16 + uVar14;
    iVar9 = stbi__get16be(s);
    uVar30 = stbi__get16be(s);
    if ((int)uVar26 < 0x1000001) {
      uVar36 = iVar9 * 0x10000;
      uVar17 = uVar36 + uVar30;
      if ((int)uVar17 < 0x1000001) {
        iVar9 = stbi__get16be(s);
        if ((iVar9 != 8) && (iVar9 != 0x10)) {
          pcVar19 = "unsupported bit depth";
          goto LAB_0010ef6e;
        }
        iVar32 = stbi__get16be(s);
        if (iVar32 != 3) {
          pcVar19 = "wrong color format";
          goto LAB_0010ef6e;
        }
        sVar11 = stbi__get32be(s);
        stbi__skip(s,sVar11);
        sVar11 = stbi__get32be(s);
        stbi__skip(s,sVar11);
        sVar11 = stbi__get32be(s);
        stbi__skip(s,sVar11);
        uVar12 = stbi__get16be(s);
        if (1 < uVar12) {
          pcVar19 = "bad compression";
          goto LAB_0010ef6e;
        }
        iVar32 = stbi__mad3sizes_valid(4,uVar17,uVar26,0);
        if (iVar32 != 0) {
          if (((bpc == 0x10) && (iVar9 == 0x10)) && (uVar12 == 0)) {
            data_02 = (stbi__uint16 *)stbi__malloc_mad3(8,uVar17,uVar26,0);
            ri->bits_per_channel = 0x10;
          }
          else {
            data_02 = (stbi__uint16 *)malloc((long)(int)(uVar26 * uVar17 * 4));
          }
          if (data_02 != (stbi__uint16 *)0x0) {
            iVar32 = uVar17 * uVar26;
            if (uVar12 == 0) {
              lVar31 = (ulong)((uVar14 | uVar16) * (uVar30 | uVar36)) - 1;
              auVar44._8_4_ = (int)lVar31;
              auVar44._0_8_ = lVar31;
              auVar44._12_4_ = (int)((ulong)lVar31 >> 0x20);
              psVar41 = data_02 + 0x1e;
              uVar12 = (uVar14 + uVar16) * (uVar30 + uVar36);
              psVar40 = data_02 + 0x1c;
              uVar34 = 0;
              auVar128._8_4_ = 0xffffffff;
              auVar128._0_8_ = 0xffffffffffffffff;
              auVar128._12_4_ = 0xffffffff;
              auVar122 = _DAT_001242e0;
              local_8930 = data_02;
              local_8910 = data_02;
              do {
                if (uVar34 < uVar10) {
                  if (ri->bits_per_channel == 0x10) {
                    if (0 < iVar32) {
                      lVar31 = 0;
                      do {
                        iVar13 = stbi__get16be(s);
                        auVar122 = _DAT_001242e0;
                        auVar128._8_4_ = 0xffffffff;
                        auVar128._0_8_ = 0xffffffffffffffff;
                        auVar128._12_4_ = 0xffffffff;
                        local_8930[lVar31 * 4] = (stbi__uint16)iVar13;
                        lVar31 = lVar31 + 1;
                      } while (uVar12 != (uint)lVar31);
                    }
                  }
                  else if (iVar9 == 0x10) {
                    if (0 < iVar32) {
                      lVar31 = 0;
                      do {
                        iVar13 = stbi__get16be(s);
                        auVar122 = _DAT_001242e0;
                        auVar128._8_4_ = 0xffffffff;
                        auVar128._0_8_ = 0xffffffffffffffff;
                        auVar128._12_4_ = 0xffffffff;
                        *(char *)(local_8910 + lVar31 * 2) = (char)((uint)iVar13 >> 8);
                        lVar31 = lVar31 + 1;
                      } while (uVar12 - (int)lVar31 != 0);
                    }
                  }
                  else if (0 < iVar32) {
                    psVar22 = s->img_buffer;
                    lVar31 = 0;
                    do {
                      if (psVar22 < s->img_buffer_end) {
LAB_0011167e:
                        s->img_buffer = psVar22 + 1;
                        sVar29 = *psVar22;
                        psVar22 = psVar22 + 1;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          auVar128._8_4_ = 0xffffffff;
                          auVar128._0_8_ = 0xffffffffffffffff;
                          auVar128._12_4_ = 0xffffffff;
                          psVar22 = s->img_buffer;
                          auVar122 = _DAT_001242e0;
                          goto LAB_0011167e;
                        }
                        sVar29 = '\0';
                      }
                      *(stbi_uc *)(local_8910 + lVar31 * 2) = sVar29;
                      lVar31 = lVar31 + 1;
                    } while (uVar12 - (int)lVar31 != 0);
                  }
                }
                else if (iVar9 == 0x10 && bpc == 0x10) {
                  if (0 < iVar32) {
                    sVar8 = -(ushort)(uVar34 == 3);
                    uVar35 = 0;
                    do {
                      auVar45._8_4_ = (int)uVar35;
                      auVar45._0_8_ = uVar35;
                      auVar45._12_4_ = (int)(uVar35 >> 0x20);
                      auVar53 = auVar44 ^ auVar122;
                      auVar74 = (auVar45 | _DAT_001242d0) ^ auVar122;
                      iVar13 = auVar53._0_4_;
                      iVar156 = -(uint)(iVar13 < auVar74._0_4_);
                      iVar37 = auVar53._4_4_;
                      auVar76._4_4_ = -(uint)(iVar37 < auVar74._4_4_);
                      iVar15 = auVar53._8_4_;
                      iVar121 = -(uint)(iVar15 < auVar74._8_4_);
                      iVar152 = auVar53._12_4_;
                      auVar76._12_4_ = -(uint)(iVar152 < auVar74._12_4_);
                      auVar101._4_4_ = iVar156;
                      auVar101._0_4_ = iVar156;
                      auVar101._8_4_ = iVar121;
                      auVar101._12_4_ = iVar121;
                      auVar53 = pshuflw(in_XMM5,auVar101,0xe8);
                      auVar75._4_4_ = -(uint)(auVar74._4_4_ == iVar37);
                      auVar75._12_4_ = -(uint)(auVar74._12_4_ == iVar152);
                      auVar75._0_4_ = auVar75._4_4_;
                      auVar75._8_4_ = auVar75._12_4_;
                      auVar126 = pshuflw(in_XMM6,auVar75,0xe8);
                      auVar76._0_4_ = auVar76._4_4_;
                      auVar76._8_4_ = auVar76._12_4_;
                      auVar74 = pshuflw(auVar53,auVar76,0xe8);
                      auVar74 = (auVar74 | auVar126 & auVar53) ^ auVar128;
                      auVar74 = packssdw(auVar74,auVar74);
                      if ((auVar74 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        psVar40[uVar35 * 4 + 0xffffffffffffffe4] = sVar8;
                      }
                      auVar76 = auVar75 & auVar101 | auVar76;
                      auVar74 = packssdw(auVar76,auVar76);
                      auVar74 = packssdw(auVar74 ^ auVar128,auVar74 ^ auVar128);
                      if ((auVar74._0_4_ >> 0x10 & 1) != 0) {
                        psVar40[uVar35 * 4 + 0xffffffffffffffe8] = sVar8;
                      }
                      auVar74 = (auVar45 | _DAT_001242c0) ^ auVar122;
                      iVar156 = -(uint)(iVar13 < auVar74._0_4_);
                      auVar117._4_4_ = -(uint)(iVar37 < auVar74._4_4_);
                      iVar121 = -(uint)(iVar15 < auVar74._8_4_);
                      auVar117._12_4_ = -(uint)(iVar152 < auVar74._12_4_);
                      auVar77._4_4_ = iVar156;
                      auVar77._0_4_ = iVar156;
                      auVar77._8_4_ = iVar121;
                      auVar77._12_4_ = iVar121;
                      auVar102._4_4_ = -(uint)(auVar74._4_4_ == iVar37);
                      auVar102._12_4_ = -(uint)(auVar74._12_4_ == iVar152);
                      auVar102._0_4_ = auVar102._4_4_;
                      auVar102._8_4_ = auVar102._12_4_;
                      auVar117._0_4_ = auVar117._4_4_;
                      auVar117._8_4_ = auVar117._12_4_;
                      auVar74 = auVar102 & auVar77 | auVar117;
                      auVar74 = packssdw(auVar74,auVar74);
                      auVar74 = packssdw(auVar74 ^ auVar128,auVar74 ^ auVar128);
                      if ((auVar74 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        psVar40[uVar35 * 4 + 0xffffffffffffffec] = sVar8;
                      }
                      auVar78 = pshufhw(auVar77,auVar77,0x84);
                      auVar51 = pshufhw(auVar102,auVar102,0x84);
                      auVar79 = pshufhw(auVar78,auVar117,0x84);
                      auVar78 = (auVar79 | auVar51 & auVar78) ^ auVar128;
                      auVar78 = packssdw(auVar78,auVar78);
                      if ((auVar78 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        psVar40[uVar35 * 4 + 0xfffffffffffffff0] = sVar8;
                      }
                      auVar78 = (auVar45 | _DAT_001242b0) ^ auVar122;
                      iVar156 = -(uint)(iVar13 < auVar78._0_4_);
                      auVar81._4_4_ = -(uint)(iVar37 < auVar78._4_4_);
                      iVar121 = -(uint)(iVar15 < auVar78._8_4_);
                      auVar81._12_4_ = -(uint)(iVar152 < auVar78._12_4_);
                      auVar103._4_4_ = iVar156;
                      auVar103._0_4_ = iVar156;
                      auVar103._8_4_ = iVar121;
                      auVar103._12_4_ = iVar121;
                      auVar74 = pshuflw(auVar74,auVar103,0xe8);
                      auVar80._4_4_ = -(uint)(auVar78._4_4_ == iVar37);
                      auVar80._12_4_ = -(uint)(auVar78._12_4_ == iVar152);
                      auVar80._0_4_ = auVar80._4_4_;
                      auVar80._8_4_ = auVar80._12_4_;
                      in_XMM6 = pshuflw(auVar126 & auVar53,auVar80,0xe8);
                      in_XMM6 = in_XMM6 & auVar74;
                      auVar81._0_4_ = auVar81._4_4_;
                      auVar81._8_4_ = auVar81._12_4_;
                      auVar53 = pshuflw(auVar74,auVar81,0xe8);
                      auVar53 = (auVar53 | in_XMM6) ^ auVar128;
                      in_XMM5 = packssdw(auVar53,auVar53);
                      if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        psVar40[uVar35 * 4 + 0xfffffffffffffff4] = sVar8;
                      }
                      auVar81 = auVar80 & auVar103 | auVar81;
                      auVar53 = packssdw(auVar81,auVar81);
                      auVar53 = packssdw(auVar53 ^ auVar128,auVar53 ^ auVar128);
                      if ((auVar53 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        psVar40[uVar35 * 4 + 0xfffffffffffffff8] = sVar8;
                      }
                      auVar53 = (auVar45 | _DAT_001242a0) ^ auVar122;
                      auVar104._0_4_ = -(uint)(iVar13 < auVar53._0_4_);
                      auVar104._4_4_ = -(uint)(iVar37 < auVar53._4_4_);
                      auVar104._8_4_ = -(uint)(iVar15 < auVar53._8_4_);
                      auVar104._12_4_ = -(uint)(iVar152 < auVar53._12_4_);
                      auVar82._4_4_ = auVar104._0_4_;
                      auVar82._0_4_ = auVar104._0_4_;
                      auVar82._8_4_ = auVar104._8_4_;
                      auVar82._12_4_ = auVar104._8_4_;
                      auVar46._4_4_ = -(uint)(auVar53._4_4_ == iVar37);
                      auVar46._12_4_ = -(uint)(auVar53._12_4_ == iVar152);
                      auVar46._0_4_ = auVar46._4_4_;
                      auVar46._8_4_ = auVar46._12_4_;
                      auVar54._4_4_ = auVar104._4_4_;
                      auVar54._0_4_ = auVar104._4_4_;
                      auVar54._8_4_ = auVar104._12_4_;
                      auVar54._12_4_ = auVar104._12_4_;
                      auVar53 = packssdw(auVar104,auVar46 & auVar82 | auVar54);
                      auVar53 = packssdw(auVar53 ^ auVar128,auVar53 ^ auVar128);
                      if ((auVar53 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        psVar40[uVar35 * 4 + 0xfffffffffffffffc] = sVar8;
                      }
                      auVar126 = pshufhw(auVar82,auVar82,0x84);
                      auVar53 = pshufhw(auVar46,auVar46,0x84);
                      auVar74 = pshufhw(auVar54,auVar54,0x84);
                      auVar53 = packssdw(auVar53 & auVar126,
                                         (auVar74 | auVar53 & auVar126) ^ auVar128);
                      if ((auVar53 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        psVar40[uVar35 * 4] = sVar8;
                      }
                      uVar35 = uVar35 + 8;
                    } while (((ulong)uVar12 + 7 & 0xfffffffffffffff8) != uVar35);
                  }
                }
                else if (0 < iVar32) {
                  cVar7 = -(uVar34 == 3);
                  uVar35 = 0;
                  do {
                    auVar53._8_4_ = (int)uVar35;
                    auVar53._0_8_ = uVar35;
                    auVar53._12_4_ = (int)(uVar35 >> 0x20);
                    auVar74 = auVar44 ^ auVar122;
                    auVar126 = (auVar53 | _DAT_001242d0) ^ auVar122;
                    iVar13 = auVar74._0_4_;
                    iVar156 = -(uint)(iVar13 < auVar126._0_4_);
                    iVar37 = auVar74._4_4_;
                    auVar78._4_4_ = -(uint)(iVar37 < auVar126._4_4_);
                    iVar15 = auVar74._8_4_;
                    iVar121 = -(uint)(iVar15 < auVar126._8_4_);
                    iVar152 = auVar74._12_4_;
                    auVar78._12_4_ = -(uint)(iVar152 < auVar126._12_4_);
                    auVar105._4_4_ = iVar156;
                    auVar105._0_4_ = iVar156;
                    auVar105._8_4_ = iVar121;
                    auVar105._12_4_ = iVar121;
                    auVar79 = pshuflw(in_XMM5,auVar105,0xe8);
                    auVar74._4_4_ = -(uint)(auVar126._4_4_ == iVar37);
                    auVar74._12_4_ = -(uint)(auVar126._12_4_ == iVar152);
                    auVar74._0_4_ = auVar74._4_4_;
                    auVar74._8_4_ = auVar74._12_4_;
                    auVar51 = pshuflw(in_XMM6,auVar74,0xe8);
                    auVar78._0_4_ = auVar78._4_4_;
                    auVar78._8_4_ = auVar78._12_4_;
                    auVar126 = pshuflw(auVar79,auVar78,0xe8);
                    auVar126 = (auVar126 | auVar51 & auVar79) ^ auVar128;
                    auVar126 = packssdw(auVar126,auVar126);
                    if ((auVar126 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar41 + uVar35 * 2 + 0xffffffffffffffe2) = cVar7;
                    }
                    auVar78 = auVar74 & auVar105 | auVar78;
                    auVar74 = packssdw(auVar78,auVar78);
                    auVar74 = packssdw(auVar74 ^ auVar128,auVar74 ^ auVar128);
                    auVar74 = packsswb(auVar74,auVar74);
                    if ((auVar74._0_4_ >> 8 & 1) != 0) {
                      *(char *)(psVar41 + uVar35 * 2 + 0xffffffffffffffe4) = cVar7;
                    }
                    auVar74 = (auVar53 | _DAT_001242c0) ^ auVar122;
                    iVar156 = -(uint)(iVar13 < auVar74._0_4_);
                    auVar118._4_4_ = -(uint)(iVar37 < auVar74._4_4_);
                    iVar121 = -(uint)(iVar15 < auVar74._8_4_);
                    auVar118._12_4_ = -(uint)(iVar152 < auVar74._12_4_);
                    auVar126._4_4_ = iVar156;
                    auVar126._0_4_ = iVar156;
                    auVar126._8_4_ = iVar121;
                    auVar126._12_4_ = iVar121;
                    auVar106._4_4_ = -(uint)(auVar74._4_4_ == iVar37);
                    auVar106._12_4_ = -(uint)(auVar74._12_4_ == iVar152);
                    auVar106._0_4_ = auVar106._4_4_;
                    auVar106._8_4_ = auVar106._12_4_;
                    auVar118._0_4_ = auVar118._4_4_;
                    auVar118._8_4_ = auVar118._12_4_;
                    auVar74 = auVar106 & auVar126 | auVar118;
                    auVar74 = packssdw(auVar74,auVar74);
                    auVar74 = packssdw(auVar74 ^ auVar128,auVar74 ^ auVar128);
                    auVar74 = packsswb(auVar74,auVar74);
                    if ((auVar74._0_4_ >> 0x10 & 1) != 0) {
                      *(char *)(psVar41 + uVar35 * 2 + 0xffffffffffffffe6) = cVar7;
                    }
                    auVar126 = pshufhw(auVar126,auVar126,0x84);
                    auVar131 = pshufhw(auVar106,auVar106,0x84);
                    auVar78 = pshufhw(auVar126,auVar118,0x84);
                    auVar126 = (auVar78 | auVar131 & auVar126) ^ auVar128;
                    auVar126 = packssdw(auVar126,auVar126);
                    auVar126 = packsswb(auVar126,auVar126);
                    if ((auVar126._0_4_ >> 0x18 & 1) != 0) {
                      *(char *)(psVar41 + uVar35 * 2 + 0xffffffffffffffe8) = cVar7;
                    }
                    auVar126 = (auVar53 | _DAT_001242b0) ^ auVar122;
                    iVar156 = -(uint)(iVar13 < auVar126._0_4_);
                    auVar84._4_4_ = -(uint)(iVar37 < auVar126._4_4_);
                    iVar121 = -(uint)(iVar15 < auVar126._8_4_);
                    auVar84._12_4_ = -(uint)(iVar152 < auVar126._12_4_);
                    auVar107._4_4_ = iVar156;
                    auVar107._0_4_ = iVar156;
                    auVar107._8_4_ = iVar121;
                    auVar107._12_4_ = iVar121;
                    auVar74 = pshuflw(auVar74,auVar107,0xe8);
                    auVar83._4_4_ = -(uint)(auVar126._4_4_ == iVar37);
                    auVar83._12_4_ = -(uint)(auVar126._12_4_ == iVar152);
                    auVar83._0_4_ = auVar83._4_4_;
                    auVar83._8_4_ = auVar83._12_4_;
                    auVar78 = pshuflw(auVar51 & auVar79,auVar83,0xe8);
                    auVar84._0_4_ = auVar84._4_4_;
                    auVar84._8_4_ = auVar84._12_4_;
                    auVar126 = pshuflw(auVar74,auVar84,0xe8);
                    auVar126 = (auVar126 | auVar78 & auVar74) ^ auVar128;
                    auVar126 = packssdw(auVar126,auVar126);
                    auVar126 = packsswb(auVar126,auVar126);
                    if ((auVar126 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar41 + uVar35 * 2 + 0xffffffffffffffea) = cVar7;
                    }
                    auVar84 = auVar83 & auVar107 | auVar84;
                    auVar126 = packssdw(auVar84,auVar84);
                    auVar126 = packssdw(auVar126 ^ auVar128,auVar126 ^ auVar128);
                    auVar126 = packsswb(auVar126,auVar126);
                    if ((auVar126._4_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar41 + uVar35 * 2 + 0xffffffffffffffec) = cVar7;
                    }
                    auVar126 = (auVar53 | _DAT_001242a0) ^ auVar122;
                    iVar156 = -(uint)(iVar13 < auVar126._0_4_);
                    auVar119._4_4_ = -(uint)(iVar37 < auVar126._4_4_);
                    iVar121 = -(uint)(iVar15 < auVar126._8_4_);
                    auVar119._12_4_ = -(uint)(iVar152 < auVar126._12_4_);
                    auVar85._4_4_ = iVar156;
                    auVar85._0_4_ = iVar156;
                    auVar85._8_4_ = iVar121;
                    auVar85._12_4_ = iVar121;
                    auVar108._4_4_ = -(uint)(auVar126._4_4_ == iVar37);
                    auVar108._12_4_ = -(uint)(auVar126._12_4_ == iVar152);
                    auVar108._0_4_ = auVar108._4_4_;
                    auVar108._8_4_ = auVar108._12_4_;
                    auVar119._0_4_ = auVar119._4_4_;
                    auVar119._8_4_ = auVar119._12_4_;
                    auVar126 = auVar108 & auVar85 | auVar119;
                    auVar126 = packssdw(auVar126,auVar126);
                    auVar126 = packssdw(auVar126 ^ auVar128,auVar126 ^ auVar128);
                    auVar126 = packsswb(auVar126,auVar126);
                    if ((auVar126 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar41 + uVar35 * 2 + 0xffffffffffffffee) = cVar7;
                    }
                    auVar79 = pshufhw(auVar85,auVar85,0x84);
                    auVar131 = pshufhw(auVar108,auVar108,0x84);
                    auVar51 = pshufhw(auVar79,auVar119,0x84);
                    auVar79 = (auVar51 | auVar131 & auVar79) ^ auVar128;
                    auVar79 = packssdw(auVar79,auVar79);
                    auVar79 = packsswb(auVar79,auVar79);
                    if ((auVar79._6_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar41 + uVar35 * 2 + 0xfffffffffffffff0) = cVar7;
                    }
                    auVar79 = (auVar53 | _DAT_00124290) ^ auVar122;
                    iVar156 = -(uint)(iVar13 < auVar79._0_4_);
                    auVar87._4_4_ = -(uint)(iVar37 < auVar79._4_4_);
                    iVar121 = -(uint)(iVar15 < auVar79._8_4_);
                    auVar87._12_4_ = -(uint)(iVar152 < auVar79._12_4_);
                    auVar109._4_4_ = iVar156;
                    auVar109._0_4_ = iVar156;
                    auVar109._8_4_ = iVar121;
                    auVar109._12_4_ = iVar121;
                    auVar126 = pshuflw(auVar126,auVar109,0xe8);
                    auVar86._4_4_ = -(uint)(auVar79._4_4_ == iVar37);
                    auVar86._12_4_ = -(uint)(auVar79._12_4_ == iVar152);
                    auVar86._0_4_ = auVar86._4_4_;
                    auVar86._8_4_ = auVar86._12_4_;
                    auVar78 = pshuflw(auVar78 & auVar74,auVar86,0xe8);
                    auVar87._0_4_ = auVar87._4_4_;
                    auVar87._8_4_ = auVar87._12_4_;
                    auVar74 = pshuflw(auVar126,auVar87,0xe8);
                    auVar74 = (auVar74 | auVar78 & auVar126) ^ auVar128;
                    auVar74 = packssdw(auVar74,auVar74);
                    auVar74 = packsswb(auVar74,auVar74);
                    if ((auVar74 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar41 + uVar35 * 2 + 0xfffffffffffffff2) = cVar7;
                    }
                    auVar87 = auVar86 & auVar109 | auVar87;
                    auVar74 = packssdw(auVar87,auVar87);
                    auVar74 = packssdw(auVar74 ^ auVar128,auVar74 ^ auVar128);
                    auVar74 = packsswb(auVar74,auVar74);
                    if ((auVar74._8_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar41 + uVar35 * 2 + 0xfffffffffffffff4) = cVar7;
                    }
                    auVar74 = (auVar53 | _DAT_00124280) ^ auVar122;
                    iVar156 = -(uint)(iVar13 < auVar74._0_4_);
                    auVar120._4_4_ = -(uint)(iVar37 < auVar74._4_4_);
                    iVar121 = -(uint)(iVar15 < auVar74._8_4_);
                    auVar120._12_4_ = -(uint)(iVar152 < auVar74._12_4_);
                    auVar88._4_4_ = iVar156;
                    auVar88._0_4_ = iVar156;
                    auVar88._8_4_ = iVar121;
                    auVar88._12_4_ = iVar121;
                    auVar110._4_4_ = -(uint)(auVar74._4_4_ == iVar37);
                    auVar110._12_4_ = -(uint)(auVar74._12_4_ == iVar152);
                    auVar110._0_4_ = auVar110._4_4_;
                    auVar110._8_4_ = auVar110._12_4_;
                    auVar120._0_4_ = auVar120._4_4_;
                    auVar120._8_4_ = auVar120._12_4_;
                    auVar74 = auVar110 & auVar88 | auVar120;
                    auVar74 = packssdw(auVar74,auVar74);
                    auVar74 = packssdw(auVar74 ^ auVar128,auVar74 ^ auVar128);
                    auVar74 = packsswb(auVar74,auVar74);
                    if ((auVar74 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      *(char *)(psVar41 + uVar35 * 2 + 0xfffffffffffffff6) = cVar7;
                    }
                    auVar79 = pshufhw(auVar88,auVar88,0x84);
                    auVar131 = pshufhw(auVar110,auVar110,0x84);
                    auVar51 = pshufhw(auVar79,auVar120,0x84);
                    auVar79 = (auVar51 | auVar131 & auVar79) ^ auVar128;
                    auVar79 = packssdw(auVar79,auVar79);
                    auVar79 = packsswb(auVar79,auVar79);
                    if ((auVar79._10_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar41 + uVar35 * 2 + 0xfffffffffffffff8) = cVar7;
                    }
                    auVar79 = (auVar53 | _DAT_00124270) ^ auVar122;
                    iVar156 = -(uint)(iVar13 < auVar79._0_4_);
                    auVar90._4_4_ = -(uint)(iVar37 < auVar79._4_4_);
                    iVar121 = -(uint)(iVar15 < auVar79._8_4_);
                    auVar90._12_4_ = -(uint)(iVar152 < auVar79._12_4_);
                    auVar111._4_4_ = iVar156;
                    auVar111._0_4_ = iVar156;
                    auVar111._8_4_ = iVar121;
                    auVar111._12_4_ = iVar121;
                    auVar74 = pshuflw(auVar74,auVar111,0xe8);
                    auVar89._4_4_ = -(uint)(auVar79._4_4_ == iVar37);
                    auVar89._12_4_ = -(uint)(auVar79._12_4_ == iVar152);
                    auVar89._0_4_ = auVar89._4_4_;
                    auVar89._8_4_ = auVar89._12_4_;
                    in_XMM6 = pshuflw(auVar78 & auVar126,auVar89,0xe8);
                    in_XMM6 = in_XMM6 & auVar74;
                    auVar90._0_4_ = auVar90._4_4_;
                    auVar90._8_4_ = auVar90._12_4_;
                    auVar74 = pshuflw(auVar74,auVar90,0xe8);
                    auVar74 = (auVar74 | in_XMM6) ^ auVar128;
                    auVar74 = packssdw(auVar74,auVar74);
                    in_XMM5 = packsswb(auVar74,auVar74);
                    if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar41 + uVar35 * 2 + 0xfffffffffffffffa) = cVar7;
                    }
                    auVar90 = auVar89 & auVar111 | auVar90;
                    auVar74 = packssdw(auVar90,auVar90);
                    auVar74 = packssdw(auVar74 ^ auVar128,auVar74 ^ auVar128);
                    auVar74 = packsswb(auVar74,auVar74);
                    if ((auVar74._12_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar41 + uVar35 * 2 + 0xfffffffffffffffc) = cVar7;
                    }
                    auVar53 = (auVar53 | _DAT_00124260) ^ auVar122;
                    auVar112._0_4_ = -(uint)(iVar13 < auVar53._0_4_);
                    auVar112._4_4_ = -(uint)(iVar37 < auVar53._4_4_);
                    auVar112._8_4_ = -(uint)(iVar15 < auVar53._8_4_);
                    auVar112._12_4_ = -(uint)(iVar152 < auVar53._12_4_);
                    auVar91._4_4_ = auVar112._0_4_;
                    auVar91._0_4_ = auVar112._0_4_;
                    auVar91._8_4_ = auVar112._8_4_;
                    auVar91._12_4_ = auVar112._8_4_;
                    auVar47._4_4_ = -(uint)(auVar53._4_4_ == iVar37);
                    auVar47._12_4_ = -(uint)(auVar53._12_4_ == iVar152);
                    auVar47._0_4_ = auVar47._4_4_;
                    auVar47._8_4_ = auVar47._12_4_;
                    auVar55._4_4_ = auVar112._4_4_;
                    auVar55._0_4_ = auVar112._4_4_;
                    auVar55._8_4_ = auVar112._12_4_;
                    auVar55._12_4_ = auVar112._12_4_;
                    auVar53 = packssdw(auVar112,auVar47 & auVar91 | auVar55);
                    auVar53 = packssdw(auVar53 ^ auVar128,auVar53 ^ auVar128);
                    auVar53 = packsswb(auVar53,auVar53);
                    if ((auVar53 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar41 + uVar35 * 2 + 0xfffffffffffffffe) = cVar7;
                    }
                    auVar126 = pshufhw(auVar91,auVar91,0x84);
                    auVar53 = pshufhw(auVar47,auVar47,0x84);
                    auVar74 = pshufhw(auVar55,auVar55,0x84);
                    auVar53 = packssdw(auVar53 & auVar126,(auVar74 | auVar53 & auVar126) ^ auVar128)
                    ;
                    auVar53 = packsswb(auVar53,auVar53);
                    if ((auVar53._14_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar41 + uVar35 * 2) = cVar7;
                    }
                    uVar35 = uVar35 + 0x10;
                  } while (((ulong)uVar12 + 0xf & 0xfffffffffffffff0) != uVar35);
                }
                uVar34 = uVar34 + 1;
                psVar41 = (stbi__uint16 *)((long)psVar41 + 1);
                psVar40 = psVar40 + 1;
                local_8910 = (stbi__uint16 *)((long)local_8910 + 1);
                local_8930 = local_8930 + 1;
              } while (uVar34 != 4);
            }
            else {
              stbi__skip(s,uVar10 * uVar26 * 2);
              lVar31 = (ulong)((uVar14 | uVar16) * (uVar30 | uVar36)) - 1;
              auVar127._8_4_ = (int)lVar31;
              auVar127._0_8_ = lVar31;
              auVar127._12_4_ = (int)((ulong)lVar31 >> 0x20);
              psVar40 = data_02 + 0x1e;
              uVar34 = 0;
              auVar122 = _DAT_00124260;
              auVar44 = _DAT_00124270;
              auVar128 = _DAT_00124280;
              auVar53 = _DAT_00124290;
              auVar74 = _DAT_001242a0;
              auVar126 = _DAT_001242b0;
              auVar78 = _DAT_001242c0;
              auVar79 = _DAT_001242d0;
              do {
                if (uVar34 < uVar10) {
                  iVar9 = stbi__psd_decode_rle(s,(stbi_uc *)((long)data_02 + uVar34),iVar32);
                  auVar122 = _DAT_00124260;
                  auVar44 = _DAT_00124270;
                  auVar128 = _DAT_00124280;
                  auVar53 = _DAT_00124290;
                  auVar74 = _DAT_001242a0;
                  auVar126 = _DAT_001242b0;
                  auVar78 = _DAT_001242c0;
                  auVar79 = _DAT_001242d0;
                  if (iVar9 == 0) {
                    free(data_02);
                    pcVar19 = "corrupt";
                    goto LAB_0010ef6e;
                  }
                }
                else if (0 < iVar32) {
                  cVar7 = -(uVar34 == 3);
                  uVar35 = 0;
                  do {
                    auVar42._8_4_ = (int)uVar35;
                    auVar42._0_8_ = uVar35;
                    auVar42._12_4_ = (int)(uVar35 >> 0x20);
                    auVar51 = auVar127 ^ _DAT_001242e0;
                    auVar131 = (auVar42 | auVar79) ^ _DAT_001242e0;
                    iVar9 = auVar51._0_4_;
                    iVar152 = -(uint)(iVar9 < auVar131._0_4_);
                    iVar13 = auVar51._4_4_;
                    auVar63._4_4_ = -(uint)(iVar13 < auVar131._4_4_);
                    iVar37 = auVar51._8_4_;
                    iVar156 = -(uint)(iVar37 < auVar131._8_4_);
                    iVar15 = auVar51._12_4_;
                    auVar63._12_4_ = -(uint)(iVar15 < auVar131._12_4_);
                    auVar93._4_4_ = iVar152;
                    auVar93._0_4_ = iVar152;
                    auVar93._8_4_ = iVar156;
                    auVar93._12_4_ = iVar156;
                    auVar51 = pshuflw(in_XMM5,auVar93,0xe8);
                    auVar62._4_4_ = -(uint)(auVar131._4_4_ == iVar13);
                    auVar62._12_4_ = -(uint)(auVar131._12_4_ == iVar15);
                    auVar62._0_4_ = auVar62._4_4_;
                    auVar62._8_4_ = auVar62._12_4_;
                    auVar133 = pshuflw(in_XMM6,auVar62,0xe8);
                    auVar63._0_4_ = auVar63._4_4_;
                    auVar63._8_4_ = auVar63._12_4_;
                    auVar131 = pshuflw(auVar51,auVar63,0xe8);
                    auVar123._8_4_ = 0xffffffff;
                    auVar123._0_8_ = 0xffffffffffffffff;
                    auVar123._12_4_ = 0xffffffff;
                    auVar51 = (auVar131 | auVar133 & auVar51) ^ auVar123;
                    auVar51 = packssdw(auVar51,auVar51);
                    if ((auVar51 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar35 * 2 + 0xffffffffffffffe2) = cVar7;
                    }
                    auVar63 = auVar62 & auVar93 | auVar63;
                    auVar51 = packssdw(auVar63,auVar63);
                    auVar51 = packssdw(auVar51 ^ auVar123,auVar51 ^ auVar123);
                    auVar51 = packsswb(auVar51,auVar51);
                    if ((auVar51._0_4_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar35 * 2 + 0xffffffffffffffe4) = cVar7;
                    }
                    auVar51 = (auVar42 | auVar78) ^ _DAT_001242e0;
                    iVar152 = -(uint)(iVar9 < auVar51._0_4_);
                    auVar114._4_4_ = -(uint)(iVar13 < auVar51._4_4_);
                    iVar156 = -(uint)(iVar37 < auVar51._8_4_);
                    auVar114._12_4_ = -(uint)(iVar15 < auVar51._12_4_);
                    auVar64._4_4_ = iVar152;
                    auVar64._0_4_ = iVar152;
                    auVar64._8_4_ = iVar156;
                    auVar64._12_4_ = iVar156;
                    auVar94._4_4_ = -(uint)(auVar51._4_4_ == iVar13);
                    auVar94._12_4_ = -(uint)(auVar51._12_4_ == iVar15);
                    auVar94._0_4_ = auVar94._4_4_;
                    auVar94._8_4_ = auVar94._12_4_;
                    auVar114._0_4_ = auVar114._4_4_;
                    auVar114._8_4_ = auVar114._12_4_;
                    auVar51 = auVar94 & auVar64 | auVar114;
                    auVar51 = packssdw(auVar51,auVar51);
                    auVar51 = packssdw(auVar51 ^ auVar123,auVar51 ^ auVar123);
                    auVar51 = packsswb(auVar51,auVar51);
                    if ((auVar51._0_4_ >> 0x10 & 1) != 0) {
                      *(char *)(psVar40 + uVar35 * 2 + 0xffffffffffffffe6) = cVar7;
                    }
                    auVar131 = pshufhw(auVar64,auVar64,0x84);
                    auVar56 = pshufhw(auVar94,auVar94,0x84);
                    auVar133 = pshufhw(auVar131,auVar114,0x84);
                    auVar131 = (auVar133 | auVar56 & auVar131) ^ auVar123;
                    auVar131 = packssdw(auVar131,auVar131);
                    auVar131 = packsswb(auVar131,auVar131);
                    if ((auVar131._0_4_ >> 0x18 & 1) != 0) {
                      *(char *)(psVar40 + uVar35 * 2 + 0xffffffffffffffe8) = cVar7;
                    }
                    auVar131 = (auVar42 | auVar126) ^ _DAT_001242e0;
                    iVar152 = -(uint)(iVar9 < auVar131._0_4_);
                    auVar66._4_4_ = -(uint)(iVar13 < auVar131._4_4_);
                    iVar156 = -(uint)(iVar37 < auVar131._8_4_);
                    auVar66._12_4_ = -(uint)(iVar15 < auVar131._12_4_);
                    auVar95._4_4_ = iVar152;
                    auVar95._0_4_ = iVar152;
                    auVar95._8_4_ = iVar156;
                    auVar95._12_4_ = iVar156;
                    auVar51 = pshuflw(auVar51,auVar95,0xe8);
                    auVar65._4_4_ = -(uint)(auVar131._4_4_ == iVar13);
                    auVar65._12_4_ = -(uint)(auVar131._12_4_ == iVar15);
                    auVar65._0_4_ = auVar65._4_4_;
                    auVar65._8_4_ = auVar65._12_4_;
                    auVar133 = pshuflw(auVar123,auVar65,0xe8);
                    auVar66._0_4_ = auVar66._4_4_;
                    auVar66._8_4_ = auVar66._12_4_;
                    auVar131 = pshuflw(auVar51,auVar66,0xe8);
                    auVar124._8_4_ = 0xffffffff;
                    auVar124._0_8_ = 0xffffffffffffffff;
                    auVar124._12_4_ = 0xffffffff;
                    auVar51 = (auVar131 | auVar133 & auVar51) ^ auVar124;
                    auVar51 = packssdw(auVar51,auVar51);
                    auVar51 = packsswb(auVar51,auVar51);
                    if ((auVar51 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar35 * 2 + 0xffffffffffffffea) = cVar7;
                    }
                    auVar66 = auVar65 & auVar95 | auVar66;
                    auVar51 = packssdw(auVar66,auVar66);
                    auVar51 = packssdw(auVar51 ^ auVar124,auVar51 ^ auVar124);
                    auVar51 = packsswb(auVar51,auVar51);
                    if ((auVar51._4_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar35 * 2 + 0xffffffffffffffec) = cVar7;
                    }
                    auVar51 = (auVar42 | auVar74) ^ _DAT_001242e0;
                    iVar152 = -(uint)(iVar9 < auVar51._0_4_);
                    auVar115._4_4_ = -(uint)(iVar13 < auVar51._4_4_);
                    iVar156 = -(uint)(iVar37 < auVar51._8_4_);
                    auVar115._12_4_ = -(uint)(iVar15 < auVar51._12_4_);
                    auVar67._4_4_ = iVar152;
                    auVar67._0_4_ = iVar152;
                    auVar67._8_4_ = iVar156;
                    auVar67._12_4_ = iVar156;
                    auVar96._4_4_ = -(uint)(auVar51._4_4_ == iVar13);
                    auVar96._12_4_ = -(uint)(auVar51._12_4_ == iVar15);
                    auVar96._0_4_ = auVar96._4_4_;
                    auVar96._8_4_ = auVar96._12_4_;
                    auVar115._0_4_ = auVar115._4_4_;
                    auVar115._8_4_ = auVar115._12_4_;
                    auVar51 = auVar96 & auVar67 | auVar115;
                    auVar51 = packssdw(auVar51,auVar51);
                    auVar51 = packssdw(auVar51 ^ auVar124,auVar51 ^ auVar124);
                    auVar51 = packsswb(auVar51,auVar51);
                    if ((auVar51 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar35 * 2 + 0xffffffffffffffee) = cVar7;
                    }
                    auVar131 = pshufhw(auVar67,auVar67,0x84);
                    auVar56 = pshufhw(auVar96,auVar96,0x84);
                    auVar133 = pshufhw(auVar131,auVar115,0x84);
                    auVar131 = (auVar133 | auVar56 & auVar131) ^ auVar124;
                    auVar131 = packssdw(auVar131,auVar131);
                    auVar131 = packsswb(auVar131,auVar131);
                    if ((auVar131._6_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar35 * 2 + 0xfffffffffffffff0) = cVar7;
                    }
                    auVar131 = (auVar42 | auVar53) ^ _DAT_001242e0;
                    iVar152 = -(uint)(iVar9 < auVar131._0_4_);
                    auVar69._4_4_ = -(uint)(iVar13 < auVar131._4_4_);
                    iVar156 = -(uint)(iVar37 < auVar131._8_4_);
                    auVar69._12_4_ = -(uint)(iVar15 < auVar131._12_4_);
                    auVar97._4_4_ = iVar152;
                    auVar97._0_4_ = iVar152;
                    auVar97._8_4_ = iVar156;
                    auVar97._12_4_ = iVar156;
                    auVar51 = pshuflw(auVar51,auVar97,0xe8);
                    auVar68._4_4_ = -(uint)(auVar131._4_4_ == iVar13);
                    auVar68._12_4_ = -(uint)(auVar131._12_4_ == iVar15);
                    auVar68._0_4_ = auVar68._4_4_;
                    auVar68._8_4_ = auVar68._12_4_;
                    auVar133 = pshuflw(auVar124,auVar68,0xe8);
                    auVar69._0_4_ = auVar69._4_4_;
                    auVar69._8_4_ = auVar69._12_4_;
                    auVar131 = pshuflw(auVar51,auVar69,0xe8);
                    auVar125._8_4_ = 0xffffffff;
                    auVar125._0_8_ = 0xffffffffffffffff;
                    auVar125._12_4_ = 0xffffffff;
                    auVar51 = (auVar131 | auVar133 & auVar51) ^ auVar125;
                    auVar51 = packssdw(auVar51,auVar51);
                    auVar51 = packsswb(auVar51,auVar51);
                    if ((auVar51 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar35 * 2 + 0xfffffffffffffff2) = cVar7;
                    }
                    auVar69 = auVar68 & auVar97 | auVar69;
                    auVar51 = packssdw(auVar69,auVar69);
                    auVar51 = packssdw(auVar51 ^ auVar125,auVar51 ^ auVar125);
                    auVar51 = packsswb(auVar51,auVar51);
                    if ((auVar51._8_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar35 * 2 + 0xfffffffffffffff4) = cVar7;
                    }
                    auVar51 = (auVar42 | auVar128) ^ _DAT_001242e0;
                    iVar152 = -(uint)(iVar9 < auVar51._0_4_);
                    auVar116._4_4_ = -(uint)(iVar13 < auVar51._4_4_);
                    iVar156 = -(uint)(iVar37 < auVar51._8_4_);
                    auVar116._12_4_ = -(uint)(iVar15 < auVar51._12_4_);
                    auVar70._4_4_ = iVar152;
                    auVar70._0_4_ = iVar152;
                    auVar70._8_4_ = iVar156;
                    auVar70._12_4_ = iVar156;
                    auVar98._4_4_ = -(uint)(auVar51._4_4_ == iVar13);
                    auVar98._12_4_ = -(uint)(auVar51._12_4_ == iVar15);
                    auVar98._0_4_ = auVar98._4_4_;
                    auVar98._8_4_ = auVar98._12_4_;
                    auVar116._0_4_ = auVar116._4_4_;
                    auVar116._8_4_ = auVar116._12_4_;
                    auVar51 = auVar98 & auVar70 | auVar116;
                    auVar51 = packssdw(auVar51,auVar51);
                    auVar51 = packssdw(auVar51 ^ auVar125,auVar51 ^ auVar125);
                    auVar51 = packsswb(auVar51,auVar51);
                    if ((auVar51 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar35 * 2 + 0xfffffffffffffff6) = cVar7;
                    }
                    auVar131 = pshufhw(auVar70,auVar70,0x84);
                    auVar56 = pshufhw(auVar98,auVar98,0x84);
                    auVar133 = pshufhw(auVar131,auVar116,0x84);
                    auVar131 = (auVar133 | auVar56 & auVar131) ^ auVar125;
                    auVar131 = packssdw(auVar131,auVar131);
                    auVar131 = packsswb(auVar131,auVar131);
                    if ((auVar131._10_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar35 * 2 + 0xfffffffffffffff8) = cVar7;
                    }
                    auVar131 = (auVar42 | auVar44) ^ _DAT_001242e0;
                    iVar152 = -(uint)(iVar9 < auVar131._0_4_);
                    auVar72._4_4_ = -(uint)(iVar13 < auVar131._4_4_);
                    iVar156 = -(uint)(iVar37 < auVar131._8_4_);
                    auVar72._12_4_ = -(uint)(iVar15 < auVar131._12_4_);
                    auVar99._4_4_ = iVar152;
                    auVar99._0_4_ = iVar152;
                    auVar99._8_4_ = iVar156;
                    auVar99._12_4_ = iVar156;
                    auVar51 = pshuflw(auVar51,auVar99,0xe8);
                    auVar71._4_4_ = -(uint)(auVar131._4_4_ == iVar13);
                    auVar71._12_4_ = -(uint)(auVar131._12_4_ == iVar15);
                    auVar71._0_4_ = auVar71._4_4_;
                    auVar71._8_4_ = auVar71._12_4_;
                    auVar133 = pshuflw(auVar125,auVar71,0xe8);
                    auVar72._0_4_ = auVar72._4_4_;
                    auVar72._8_4_ = auVar72._12_4_;
                    auVar131 = pshuflw(auVar51,auVar72,0xe8);
                    in_XMM6._8_4_ = 0xffffffff;
                    in_XMM6._0_8_ = 0xffffffffffffffff;
                    in_XMM6._12_4_ = 0xffffffff;
                    auVar51 = (auVar131 | auVar133 & auVar51) ^ in_XMM6;
                    auVar51 = packssdw(auVar51,auVar51);
                    in_XMM5 = packsswb(auVar51,auVar51);
                    if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar35 * 2 + 0xfffffffffffffffa) = cVar7;
                    }
                    auVar72 = auVar71 & auVar99 | auVar72;
                    auVar51 = packssdw(auVar72,auVar72);
                    auVar51 = packssdw(auVar51 ^ in_XMM6,auVar51 ^ in_XMM6);
                    auVar51 = packsswb(auVar51,auVar51);
                    if ((auVar51._12_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar35 * 2 + 0xfffffffffffffffc) = cVar7;
                    }
                    auVar51 = (auVar42 | auVar122) ^ _DAT_001242e0;
                    auVar100._0_4_ = -(uint)(iVar9 < auVar51._0_4_);
                    auVar100._4_4_ = -(uint)(iVar13 < auVar51._4_4_);
                    auVar100._8_4_ = -(uint)(iVar37 < auVar51._8_4_);
                    auVar100._12_4_ = -(uint)(iVar15 < auVar51._12_4_);
                    auVar73._4_4_ = auVar100._0_4_;
                    auVar73._0_4_ = auVar100._0_4_;
                    auVar73._8_4_ = auVar100._8_4_;
                    auVar73._12_4_ = auVar100._8_4_;
                    auVar43._4_4_ = -(uint)(auVar51._4_4_ == iVar13);
                    auVar43._12_4_ = -(uint)(auVar51._12_4_ == iVar15);
                    auVar43._0_4_ = auVar43._4_4_;
                    auVar43._8_4_ = auVar43._12_4_;
                    auVar52._4_4_ = auVar100._4_4_;
                    auVar52._0_4_ = auVar100._4_4_;
                    auVar52._8_4_ = auVar100._12_4_;
                    auVar52._12_4_ = auVar100._12_4_;
                    auVar51 = packssdw(auVar100,auVar43 & auVar73 | auVar52);
                    auVar51 = packssdw(auVar51 ^ in_XMM6,auVar51 ^ in_XMM6);
                    auVar51 = packsswb(auVar51,auVar51);
                    if ((auVar51 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar35 * 2 + 0xfffffffffffffffe) = cVar7;
                    }
                    auVar133 = pshufhw(auVar73,auVar73,0x84);
                    auVar51 = pshufhw(auVar43,auVar43,0x84);
                    auVar131 = pshufhw(auVar52,auVar52,0x84);
                    auVar51 = packssdw(auVar51 & auVar133,(auVar131 | auVar51 & auVar133) ^ in_XMM6)
                    ;
                    auVar51 = packsswb(auVar51,auVar51);
                    if ((auVar51._14_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar35 * 2) = cVar7;
                    }
                    uVar35 = uVar35 + 0x10;
                  } while (((ulong)((uVar14 + uVar16) * (uVar30 + uVar36)) + 0xf &
                           0xfffffffffffffff0) != uVar35);
                }
                uVar34 = uVar34 + 1;
                psVar40 = (stbi__uint16 *)((long)psVar40 + 1);
              } while (uVar34 != 4);
            }
            if (3 < uVar10) {
              if (ri->bits_per_channel == 0x10) {
                if (0 < iVar32) {
                  uVar34 = 0;
                  do {
                    uVar2 = data_02[uVar34 * 4 + 3];
                    if ((uVar2 != 0) && (uVar2 != 0xffff)) {
                      fVar113 = 1.0 / ((float)uVar2 / 65535.0);
                      fVar92 = (1.0 - fVar113) * 65535.0;
                      auVar122._0_4_ =
                           (int)(fVar92 + fVar113 * (float)(*(uint *)(data_02 + uVar34 * 4) & 0xffff
                                                           ));
                      auVar122._4_4_ =
                           (int)(fVar92 + fVar113 * (float)(*(uint *)(data_02 + uVar34 * 4) >> 0x10)
                                );
                      auVar122._8_4_ = (int)(fVar92 + fVar113 * 0.0);
                      auVar122._12_4_ = (int)(fVar92 + fVar113 * 0.0);
                      auVar122 = pshuflw(auVar122,auVar122,0xe8);
                      *(int *)(data_02 + uVar34 * 4) = auVar122._0_4_;
                      data_02[uVar34 * 4 + 2] =
                           (stbi__uint16)(int)((float)data_02[uVar34 * 4 + 2] * fVar113 + fVar92);
                    }
                    uVar34 = uVar34 + 1;
                  } while ((uVar14 + uVar16) * (uVar30 + uVar36) != uVar34);
                }
              }
              else if (0 < iVar32) {
                uVar34 = 0;
                do {
                  bVar25 = *(byte *)((long)data_02 + uVar34 * 4 + 3);
                  if ((bVar25 != 0) && (bVar25 != 0xff)) {
                    fVar113 = 1.0 / ((float)bVar25 / 255.0);
                    fVar92 = (1.0 - fVar113) * 255.0;
                    *(char *)(data_02 + uVar34 * 2) =
                         (char)(int)((float)(byte)data_02[uVar34 * 2] * fVar113 + fVar92);
                    *(char *)((long)data_02 + uVar34 * 4 + 1) =
                         (char)(int)((float)*(byte *)((long)data_02 + uVar34 * 4 + 1) * fVar113 +
                                    fVar92);
                    *(char *)(data_02 + uVar34 * 2 + 1) =
                         (char)(int)((float)(byte)data_02[uVar34 * 2 + 1] * fVar113 + fVar92);
                  }
                  uVar34 = uVar34 + 1;
                } while ((uVar14 + uVar16) * (uVar30 + uVar36) != uVar34);
              }
            }
            if ((req_comp & 0xfffffffbU) != 0) {
              if (ri->bits_per_channel == 0x10) {
                data_02 = stbi__convert_format16(data_02,4,req_comp,uVar17,uVar26);
              }
              else {
                data_02 = (stbi__uint16 *)
                          stbi__convert_format((uchar *)data_02,4,req_comp,uVar17,uVar26);
              }
              if (data_02 == (stbi__uint16 *)0x0) {
                return (void *)0x0;
              }
            }
            if (comp != (int *)0x0) {
              *comp = 4;
            }
            *y = uVar26;
            *x = uVar17;
            return data_02;
          }
          goto LAB_00110e23;
        }
      }
    }
  }
LAB_0010fa81:
  pcVar19 = "too large";
LAB_0010ef6e:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar19;
  return (void *)0x0;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}